

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fire_PDU.cpp
# Opt level: O0

void __thiscall KDIS::PDU::Fire_PDU::SetDescriptor(Fire_PDU *this,DescPtr *D)

{
  Descriptor *pDVar1;
  long local_30;
  DescPtr *D_local;
  Fire_PDU *this_local;
  
  UTILS::KRef_Ptr<KDIS::DATA_TYPE::Descriptor>::operator=(&this->m_pDescriptor,D);
  pDVar1 = UTILS::KRef_Ptr<KDIS::DATA_TYPE::Descriptor>::GetPtr(&this->m_pDescriptor);
  if (pDVar1 == (Descriptor *)0x0) {
    local_30 = 0;
  }
  else {
    local_30 = __dynamic_cast(pDVar1,&DATA_TYPE::Descriptor::typeinfo,
                              &DATA_TYPE::MunitionDescriptor::typeinfo,0);
  }
  if (local_30 == 0) {
    (this->super_Warfare_Header).super_Header.super_Header6.field_0x25 =
         (this->super_Warfare_Header).super_Header.super_Header6.field_0x25 & 0xfe | 1;
    (this->super_Warfare_Header).super_Header.super_Header6.m_ui8ProtocolVersion = '\a';
  }
  else {
    (this->super_Warfare_Header).super_Header.super_Header6.field_0x25 =
         (this->super_Warfare_Header).super_Header.super_Header6.field_0x25 & 0xfe;
  }
  return;
}

Assistant:

void Fire_PDU::SetDescriptor( DescPtr D )
{
    m_pDescriptor = D;

    #if DIS_VERSION > 6

    // Determine the FTI
    if( dynamic_cast<MunitionDescriptor*>( m_pDescriptor.GetPtr() ) )
    {
        m_PDUStatusUnion.m_ui8PDUStatusFTI = MunitionFTI;
    }
    else
    {
        m_PDUStatusUnion.m_ui8PDUStatusFTI = ExpendableFTI;
        m_ui8ProtocolVersion = IEEE_1278_1_2012; // We are using a DIS 7 feature now.
    }

    #endif
}